

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O2

void testProcrustesImp<float>(void)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  size_t numPoints;
  float __x;
  float fVar6;
  double local_2d8;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> toPoints;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> fromPoints;
  undefined1 local_288 [4];
  float fStack_284;
  float fStack_280;
  undefined4 uStack_27c;
  double local_278;
  double dStack_270;
  double local_268;
  double dStack_260;
  double local_258;
  double dStack_250;
  double local_248;
  double dStack_240;
  double local_238;
  double dStack_230;
  double local_228;
  double dStack_220;
  double local_218;
  double dStack_210;
  Rand48 random;
  Matrix44<double> local_1f8;
  Euler<double> local_178;
  Euler<double> local_158;
  Matrix44<double> local_138;
  Matrix44<double> local_b8;
  
  Imath_2_5::procrustesRotationAndTranslation<float>
            ((Vec3 *)&local_b8,(Vec3 *)0x0,(float *)0x0,0,false);
  local_1f8.x[1][2] = 0.0;
  local_1f8.x[2][1] = 0.0;
  local_1f8.x[3][1] = 0.0;
  local_1f8.x[3][2] = 0.0;
  local_1f8.x[2][3] = 0.0;
  local_1f8.x[3][0] = 0.0;
  local_1f8.x[1][3] = 0.0;
  local_1f8.x[2][0] = 0.0;
  local_1f8.x[0][3] = 0.0;
  local_1f8.x[1][0] = 0.0;
  local_1f8.x[0][1] = 0.0;
  local_1f8.x[0][2] = 0.0;
  local_1f8.x[0][0] = 1.0;
  local_1f8.x[1][1] = 1.0;
  local_1f8.x[2][2] = 1.0;
  local_1f8.x[3][3] = 1.0;
  bVar3 = Imath_2_5::Matrix44<double>::operator==(&local_b8,&local_1f8);
  if (!bVar3) {
    __assert_fail("id == IMATH_INTERNAL_NAMESPACE::M44d()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                  ,0x127,"void testProcrustesImp() [T = float]");
  }
  Imath_2_5::procrustesRotationAndTranslation<float>((Vec3 *)&local_1f8,(Vec3 *)0x0,0,false);
  local_b8.x[0][0] = local_1f8.x[0][0];
  local_b8.x[0][1] = local_1f8.x[0][1];
  local_b8.x[0][2] = local_1f8.x[0][2];
  local_b8.x[0][3] = local_1f8.x[0][3];
  local_b8.x[1][0] = local_1f8.x[1][0];
  local_b8.x[1][1] = local_1f8.x[1][1];
  local_b8.x[1][2] = local_1f8.x[1][2];
  local_b8.x[1][3] = local_1f8.x[1][3];
  local_b8.x[2][0] = local_1f8.x[2][0];
  local_b8.x[2][1] = local_1f8.x[2][1];
  local_b8.x[2][2] = local_1f8.x[2][2];
  local_b8.x[2][3] = local_1f8.x[2][3];
  local_b8.x[3][0] = local_1f8.x[3][0];
  local_b8.x[3][1] = local_1f8.x[3][1];
  local_b8.x[3][2] = local_1f8.x[3][2];
  local_b8.x[3][3] = local_1f8.x[3][3];
  local_1f8.x[1][2] = 0.0;
  local_1f8.x[2][1] = 0.0;
  local_1f8.x[3][1] = 0.0;
  local_1f8.x[3][2] = 0.0;
  local_1f8.x[2][3] = 0.0;
  local_1f8.x[3][0] = 0.0;
  local_1f8.x[1][3] = 0.0;
  local_1f8.x[2][0] = 0.0;
  local_1f8.x[0][3] = 0.0;
  local_1f8.x[1][0] = 0.0;
  local_1f8.x[0][1] = 0.0;
  local_1f8.x[0][2] = 0.0;
  local_1f8.x[0][0] = 1.0;
  local_1f8.x[1][1] = 1.0;
  local_1f8.x[2][2] = 1.0;
  local_1f8.x[3][3] = 1.0;
  bVar3 = Imath_2_5::Matrix44<double>::operator==(&local_b8,&local_1f8);
  if (!bVar3) {
    __assert_fail("id == IMATH_INTERNAL_NAMESPACE::M44d()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                  ,300,"void testProcrustesImp() [T = float]");
  }
  local_1f8.x[1][2] = 0.0;
  local_1f8.x[2][1] = 0.0;
  local_1f8.x[3][1] = 0.0;
  local_1f8.x[3][2] = 0.0;
  local_1f8.x[2][3] = 0.0;
  local_1f8.x[3][0] = 0.0;
  local_1f8.x[1][3] = 0.0;
  local_1f8.x[2][0] = 0.0;
  local_1f8.x[0][3] = 0.0;
  local_1f8.x[1][0] = 0.0;
  local_1f8.x[0][1] = 0.0;
  local_1f8.x[0][2] = 0.0;
  local_1f8.x[0][0] = 1.0;
  local_1f8.x[1][1] = 1.0;
  local_1f8.x[2][2] = 1.0;
  local_1f8.x[3][3] = 1.0;
  testTranslationRotationMatrix<float>(&local_1f8);
  local_288 = (undefined1  [4])0x0;
  fStack_284 = 2.125;
  fStack_280 = 0.0;
  uStack_27c = 0x40140000;
  local_278 = -0.2;
  Imath_2_5::Matrix44<double>::translate<double>(&local_1f8,(Vec3<double> *)local_288);
  testTranslationRotationMatrix<float>(&local_1f8);
  local_288 = (undefined1  [4])0x54442d18;
  fStack_284 = 2.142699;
  fStack_280 = 0.0;
  uStack_27c = 0;
  local_278 = 0.0;
  Imath_2_5::Matrix44<double>::rotate<double>(&local_1f8,(Vec3<double> *)local_288);
  testTranslationRotationMatrix<float>(&local_1f8);
  local_288 = (undefined1  [4])0x0;
  fStack_284 = 0.0;
  fStack_280 = 3.3702806e+12;
  uStack_27c = 0x3fe921fb;
  local_278 = 0.0;
  Imath_2_5::Matrix44<double>::rotate<double>(&local_1f8,(Vec3<double> *)local_288);
  testTranslationRotationMatrix<float>(&local_1f8);
  local_288 = (undefined1  [4])0x0;
  fStack_284 = 0.0;
  fStack_280 = 0.0;
  uStack_27c = 0;
  local_278 = -2.356194490192345;
  Imath_2_5::Matrix44<double>::rotate<double>(&local_1f8,(Vec3<double> *)local_288);
  testTranslationRotationMatrix<float>(&local_1f8);
  local_1f8.x[1][2] = 0.0;
  local_1f8.x[2][1] = 0.0;
  local_1f8.x[3][1] = 0.0;
  local_1f8.x[3][2] = 0.0;
  local_1f8.x[2][3] = 0.0;
  local_1f8.x[3][0] = 0.0;
  local_1f8.x[1][3] = 0.0;
  local_1f8.x[2][0] = 0.0;
  local_1f8.x[0][3] = 0.0;
  local_1f8.x[1][0] = 0.0;
  local_1f8.x[0][1] = 0.0;
  local_1f8.x[0][2] = 0.0;
  local_1f8.x[0][0] = 1.0;
  local_1f8.x[1][1] = 1.0;
  local_1f8.x[2][2] = 1.0;
  local_1f8.x[3][3] = 1.0;
  testWithTranslateRotateAndScale<float>(&local_1f8);
  local_288 = (undefined1  [4])0x9999999a;
  fStack_284 = 1.6999999;
  fStack_280 = 0.0;
  uStack_27c = 0x40180000;
  local_278 = 10.0;
  Imath_2_5::Matrix44<double>::translate<double>(&local_1f8,(Vec3<double> *)local_288);
  testWithTranslateRotateAndScale<float>(&local_1f8);
  local_288 = (undefined1  [4])0x54442d18;
  fStack_284 = 2.142699;
  fStack_280 = 0.0;
  uStack_27c = 0;
  local_278 = 0.0;
  Imath_2_5::Matrix44<double>::rotate<double>(&local_1f8,(Vec3<double> *)local_288);
  testWithTranslateRotateAndScale<float>(&local_1f8);
  local_288 = (undefined1  [4])0x0;
  fStack_284 = 0.0;
  fStack_280 = 3.3702806e+12;
  uStack_27c = 0x3fe921fb;
  local_278 = 0.0;
  Imath_2_5::Matrix44<double>::rotate<double>(&local_1f8,(Vec3<double> *)local_288);
  testWithTranslateRotateAndScale<float>(&local_1f8);
  local_288 = (undefined1  [4])0x0;
  fStack_284 = 0.0;
  fStack_280 = 0.0;
  uStack_27c = 0;
  local_278 = -2.356194490192345;
  Imath_2_5::Matrix44<double>::rotate<double>(&local_1f8,(Vec3<double> *)local_288);
  testWithTranslateRotateAndScale<float>(&local_1f8);
  local_288 = (undefined1  [4])0x0;
  fStack_284 = 2.0;
  fStack_280 = 0.0;
  uStack_27c = 0x40000000;
  local_278 = 2.0;
  Imath_2_5::Matrix44<double>::scale<double>(&local_1f8,(Vec3<double> *)local_288);
  testWithTranslateRotateAndScale<float>(&local_1f8);
  local_288 = (undefined1  [4])0x47ae147b;
  fStack_284 = 1.035;
  fStack_280 = 89128.96;
  uStack_27c = 0x3f847ae1;
  local_278 = 0.01;
  Imath_2_5::Matrix44<double>::scale<double>(&local_1f8,(Vec3<double> *)local_288);
  testWithTranslateRotateAndScale<float>(&local_1f8);
  fromPoints.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fromPoints.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fromPoints.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  toPoints.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  toPoints.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  toPoints.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 2) {
    __x = (float)lVar5 / 3.1415927;
    fVar6 = cosf(__x);
    fStack_284 = sinf(__x);
    fStack_280 = 0.0;
    local_288 = (undefined1  [4])fVar6;
    std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
    emplace_back<Imath_2_5::Vec3<float>>
              ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)&fromPoints,
               (Vec3<float> *)local_288);
    dVar1 = cos((double)__x + 1.0471975511965976);
    dVar2 = sin((double)__x + 1.0471975511965976);
    local_288 = (undefined1  [4])(float)dVar1;
    fStack_284 = (float)dVar2;
    fStack_280 = 0.0;
    std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
    emplace_back<Imath_2_5::Vec3<float>>
              ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)&toPoints,
               (Vec3<float> *)local_288);
  }
  verifyProcrustes<float>(&fromPoints,&toPoints);
  random._state[0] = 0x7c67;
  random._state[1] = 0x1005;
  random._state[2] = 0x7c67;
  for (lVar5 = 1; lVar5 != 10; lVar5 = lVar5 + 1) {
    if (fromPoints.
        super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish !=
        fromPoints.
        super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_start) {
      fromPoints.
      super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           fromPoints.
           super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    lVar4 = lVar5;
    if (toPoints.
        super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish !=
        toPoints.
        super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_start) {
      toPoints.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           toPoints.
           super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    while (lVar4 != 0) {
      dVar1 = (double)Imath_2_5::erand48(random._state);
      local_2d8 = (double)Imath_2_5::erand48(random._state);
      dVar2 = (double)Imath_2_5::erand48(random._state);
      local_288 = (undefined1  [4])(float)dVar1;
      fStack_284 = (float)local_2d8;
      fStack_280 = (float)dVar2;
      std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
      emplace_back<Imath_2_5::Vec3<float>>
                ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)
                 &fromPoints,(Vec3<float> *)local_288);
      dVar1 = (double)Imath_2_5::erand48(random._state);
      local_2d8 = (double)Imath_2_5::erand48(random._state);
      dVar2 = (double)Imath_2_5::erand48(random._state);
      local_288 = (undefined1  [4])(float)dVar1;
      fStack_284 = (float)local_2d8;
      fStack_280 = (float)dVar2;
      std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
      emplace_back<Imath_2_5::Vec3<float>>
                ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)&toPoints,
                 (Vec3<float> *)local_288);
      lVar4 = lVar4 + -1;
    }
  }
  verifyProcrustes<float>(&fromPoints,&toPoints);
  testProcrustesWithMatrix<float>(&local_1f8);
  local_288 = (undefined1  [4])0x40400000;
  fStack_284 = 4.0;
  fStack_280 = 1.0;
  Imath_2_5::Matrix44<double>::translate<float>(&local_1f8,(Vec3<float> *)local_288);
  testProcrustesWithMatrix<float>(&local_1f8);
  local_288 = (undefined1  [4])0xc1200000;
  fStack_284 = 2.0;
  fStack_280 = 1.0;
  Imath_2_5::Matrix44<double>::translate<float>(&local_1f8,(Vec3<float> *)local_288);
  testProcrustesWithMatrix<float>(&local_1f8);
  Imath_2_5::Euler<double>::setOrder(&local_158,Default);
  local_158.super_Vec3<double>.x = 1.0471975511965976;
  local_158.super_Vec3<double>.y = 2.356194490192345;
  local_158.super_Vec3<double>.z = 0.0;
  Imath_2_5::Euler<double>::toMatrix44(&local_138,&local_158);
  Imath_2_5::Matrix44<double>::operator*((Matrix44<double> *)local_288,&local_1f8,&local_138);
  local_1f8.x[0][0] = (double)CONCAT44(fStack_284,local_288);
  local_1f8.x[0][1] = (double)CONCAT44(uStack_27c,fStack_280);
  local_1f8.x[0][2] = local_278;
  local_1f8.x[0][3] = dStack_270;
  local_1f8.x[1][0] = local_268;
  local_1f8.x[1][1] = dStack_260;
  local_1f8.x[1][2] = local_258;
  local_1f8.x[1][3] = dStack_250;
  local_1f8.x[2][0] = local_248;
  local_1f8.x[2][1] = dStack_240;
  local_1f8.x[2][2] = local_238;
  local_1f8.x[2][3] = dStack_230;
  local_1f8.x[3][0] = local_228;
  local_1f8.x[3][1] = dStack_220;
  local_1f8.x[3][2] = local_218;
  local_1f8.x[3][3] = dStack_210;
  testProcrustesWithMatrix<float>(&local_1f8);
  local_288 = (undefined1  [4])0x3fc00000;
  fStack_284 = 6.4;
  fStack_280 = 2.0;
  Imath_2_5::Matrix44<double>::scale<float>(&local_1f8,(Vec3<float> *)local_288);
  testProcrustesWithMatrix<float>(&local_1f8);
  Imath_2_5::Euler<double>::setOrder(&local_178,Default);
  local_178.super_Vec3<double>.x = 1.0;
  local_178.super_Vec3<double>.y = 3.141592653589793;
  local_178.super_Vec3<double>.z = 1.0471975511965976;
  Imath_2_5::Euler<double>::toMatrix44(&local_138,&local_158);
  Imath_2_5::Matrix44<double>::operator*((Matrix44<double> *)local_288,&local_1f8,&local_138);
  local_1f8.x[0][0] = (double)CONCAT44(fStack_284,local_288);
  local_1f8.x[0][1] = (double)CONCAT44(uStack_27c,fStack_280);
  local_1f8.x[0][2] = local_278;
  local_1f8.x[0][3] = dStack_270;
  local_1f8.x[1][0] = local_268;
  local_1f8.x[1][1] = dStack_260;
  local_1f8.x[1][2] = local_258;
  local_1f8.x[1][3] = dStack_250;
  local_1f8.x[2][0] = local_248;
  local_1f8.x[2][1] = dStack_240;
  local_1f8.x[2][2] = local_238;
  local_1f8.x[2][3] = dStack_230;
  local_1f8.x[3][0] = local_228;
  local_1f8.x[3][1] = dStack_220;
  local_1f8.x[3][2] = local_218;
  local_1f8.x[3][3] = dStack_210;
  local_288 = (undefined1  [4])0xbf800000;
  fStack_284 = 1.0;
  fStack_280 = 1.0;
  Imath_2_5::Matrix44<double>::scale<float>(&local_1f8,(Vec3<float> *)local_288);
  testProcrustesWithMatrix<float>(&local_1f8);
  local_288 = (undefined1  [4])0x3f800000;
  fStack_284 = 0.001;
  fStack_280 = 1.0;
  Imath_2_5::Matrix44<double>::scale<float>(&local_1f8,(Vec3<float> *)local_288);
  testProcrustesWithMatrix<float>(&local_1f8);
  local_288 = (undefined1  [4])0x3f800000;
  fStack_284 = 1.0;
  fStack_280 = 0.0;
  Imath_2_5::Matrix44<double>::scale<float>(&local_1f8,(Vec3<float> *)local_288);
  testProcrustesWithMatrix<float>(&local_1f8);
  std::_Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::~_Vector_base
            (&toPoints.
              super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>);
  std::_Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::~_Vector_base
            (&fromPoints.
              super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>);
  return;
}

Assistant:

void
testProcrustesImp ()
{
    // Test the empty case:
    IMATH_INTERNAL_NAMESPACE::M44d id = 
        procrustesRotationAndTranslation ((IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0, 
                                          (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
                                          (T*) 0,
                                          0);
    assert (id == IMATH_INTERNAL_NAMESPACE::M44d());

    id = procrustesRotationAndTranslation ((IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0, 
                                           (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
                                           0);
    assert (id == IMATH_INTERNAL_NAMESPACE::M44d());

    // First we'll test with a bunch of known translation/rotation matrices
    // to make sure we get back exactly the same points:
    IMATH_INTERNAL_NAMESPACE::M44d m;
    m.makeIdentity();
    testTranslationRotationMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::V3d(3.0, 5.0, -0.2));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(M_PI, 0, 0));
    testTranslationRotationMatrix<T> (m);
    
    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, M_PI/4.0, 0));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, 0, -3.0/4.0 * M_PI));
    testTranslationRotationMatrix<T> (m);

    m.makeIdentity();
    testWithTranslateRotateAndScale<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::V3d(0.4, 6.0, 10.0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(M_PI, 0, 0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, M_PI/4.0, 0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, 0, -3.0/4.0 * M_PI));
    testWithTranslateRotateAndScale<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::V3d(2.0, 2.0, 2.0));
    testWithTranslateRotateAndScale<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::V3d(0.01, 0.01, 0.01));
    testWithTranslateRotateAndScale<T> (m);

    // Now we'll test with some random point sets and verify
    // the various Procrustes properties:
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > fromPoints;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > toPoints;
    fromPoints.clear(); toPoints.clear();

    for (size_t i = 0; i < 4; ++i)
    {
        const T theta = T(2*i) / T(M_PI);
        fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(cos(theta), sin(theta), 0));
        toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(cos(theta + M_PI/3.0), sin(theta + M_PI/3.0), 0));
    }
    verifyProcrustes (fromPoints, toPoints);

    IMATH_INTERNAL_NAMESPACE::Rand48 random (1209);
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        fromPoints.clear(); toPoints.clear();
        for (size_t i = 0; i < numPoints; ++i)
        {
            fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(random.nextf(), random.nextf(), random.nextf()));
            toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(random.nextf(), random.nextf(), random.nextf()));
        }
    }
    verifyProcrustes (fromPoints, toPoints);

    // Test with some known matrices of varying degrees of quality:
    testProcrustesWithMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::Vec3<T>(3, 4, 1));
    testProcrustesWithMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::Vec3<T>(-10, 2, 1));
    testProcrustesWithMatrix<T> (m);

    IMATH_INTERNAL_NAMESPACE::Eulerd rot (M_PI/3.0, 3.0*M_PI/4.0, 0);
    m = m * rot.toMatrix44();
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(1.5, 6.4, 2.0));
    testProcrustesWithMatrix<T> (m);

    IMATH_INTERNAL_NAMESPACE::Eulerd rot2 (1.0, M_PI, M_PI/3.0);
    m = m * rot.toMatrix44();

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(-1, 1, 1));
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(1, 0.001, 1));
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(1, 1, 0));
    testProcrustesWithMatrix<T> (m);
}